

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<QList<int>_>::moveAppend
          (QGenericArrayOps<QList<int>_> *this,QList<int> *b,QList<int> *e)

{
  qsizetype *pqVar1;
  QList<int> *pQVar2;
  
  if (b != e) {
    pQVar2 = (this->super_QArrayDataPointer<QList<int>_>).ptr;
    for (; b < e; b = (QList<int> *)(&b->d + 1)) {
      QArrayDataPointer<int>::QArrayDataPointer
                (&pQVar2[(this->super_QArrayDataPointer<QList<int>_>).size].d,&b->d);
      pqVar1 = &(this->super_QArrayDataPointer<QList<int>_>).size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  return;
}

Assistant:

void moveAppend(T *b, T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e)
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(std::move(*b));
            ++b;
            ++this->size;
        }
    }